

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopUtils::PartiallyUnroll(LoopUtils *this,size_t factor)

{
  IRContext *c;
  int64_t iVar1;
  bool bVar2;
  BasicBlock *this_00;
  Function *function;
  size_t sVar3;
  undefined1 local_1d0 [8];
  LoopUnrollerUtilsImpl unroller;
  size_t factor_local;
  LoopUtils *this_local;
  
  if ((factor == 1) || (unroller.loop_init_value_ = factor, bVar2 = CanPerformUnroll(this), !bVar2))
  {
    this_local._7_1_ = false;
  }
  else {
    c = this->context_;
    this_00 = Loop::GetHeaderBlock(this->loop_);
    function = BasicBlock::GetParent(this_00);
    anon_unknown_0::LoopUnrollerUtilsImpl::LoopUnrollerUtilsImpl
              ((LoopUnrollerUtilsImpl *)local_1d0,c,function);
    anon_unknown_0::LoopUnrollerUtilsImpl::Init((LoopUnrollerUtilsImpl *)local_1d0,this->loop_);
    iVar1 = unroller.loop_init_value_;
    sVar3 = anon_unknown_0::LoopUnrollerUtilsImpl::GetLoopIterationCount
                      ((LoopUnrollerUtilsImpl *)local_1d0);
    if ((ulong)iVar1 < sVar3) {
      sVar3 = anon_unknown_0::LoopUnrollerUtilsImpl::GetLoopIterationCount
                        ((LoopUnrollerUtilsImpl *)local_1d0);
      if (sVar3 % (ulong)unroller.loop_init_value_ == 0) {
        anon_unknown_0::LoopUnrollerUtilsImpl::PartiallyUnroll
                  ((LoopUnrollerUtilsImpl *)local_1d0,this->loop_,unroller.loop_init_value_);
      }
      else {
        anon_unknown_0::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor
                  ((LoopUnrollerUtilsImpl *)local_1d0,this->loop_,unroller.loop_init_value_);
      }
    }
    else {
      anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
                ((LoopUnrollerUtilsImpl *)local_1d0,this->loop_);
    }
    this_local._7_1_ = true;
    anon_unknown_0::LoopUnrollerUtilsImpl::~LoopUnrollerUtilsImpl
              ((LoopUnrollerUtilsImpl *)local_1d0);
  }
  return this_local._7_1_;
}

Assistant:

bool LoopUtils::PartiallyUnroll(size_t factor) {
  if (factor == 1 || !CanPerformUnroll()) return false;

  // Create the unroller utility.
  LoopUnrollerUtilsImpl unroller{context_,
                                 loop_->GetHeaderBlock()->GetParent()};
  unroller.Init(loop_);

  // If the unrolling factor is larger than or the same size as the loop just
  // fully unroll the loop.
  if (factor >= unroller.GetLoopIterationCount()) {
    unroller.FullyUnroll(loop_);
    return true;
  }

  // If the loop unrolling factor is an residual number of iterations we need to
  // let run the loop for the residual part then let it branch into the unrolled
  // remaining part. We add one when calucating the remainder to take into
  // account the one iteration already in the loop.
  if (unroller.GetLoopIterationCount() % factor != 0) {
    unroller.PartiallyUnrollResidualFactor(loop_, factor);
  } else {
    unroller.PartiallyUnroll(loop_, factor);
  }

  return true;
}